

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

bool __thiscall gnilk::LogManager::RemoveSink(LogManager *this,string *name)

{
  mutex *__mutex;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  __position;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *puVar7;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  __it;
  
  __mutex = &this->sinkLock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  __it._M_current =
       (this->sinks).
       super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar1 - (long)__it._M_current;
  if (0 < (long)uVar4 >> 5) {
    puVar7 = (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
             ((long)&((__it._M_current)->_M_t).
                     super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
                     .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl +
             (uVar4 & 0xffffffffffffffe0));
    lVar6 = ((long)uVar4 >> 5) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)name,__it);
      __position._M_current = __it._M_current;
      if (bVar2) goto LAB_001467d8;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)name,__it._M_current + 1);
      __position._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_001467d8;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)name,__it._M_current + 2);
      __position._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_001467d8;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                          *)name,__it._M_current + 3);
      __position._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_001467d8;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    uVar4 = (long)puVar1 - (long)puVar7;
    __it._M_current = puVar7;
  }
  lVar6 = (long)uVar4 >> 3;
  if (lVar6 == 1) {
LAB_001467c4:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)name,__it);
    __position._M_current = __it._M_current;
    if (!bVar2) {
      __position._M_current = puVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_001467ac:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)name,__it);
    __position._M_current = __it._M_current;
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001467c4;
    }
  }
  else {
    if (lVar6 != 3) {
      bVar2 = false;
      goto LAB_00146806;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)name,__it);
    __position._M_current = __it._M_current;
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001467ac;
    }
  }
LAB_001467d8:
  if (__position._M_current == puVar1) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ::_M_erase(&this->sinks,(iterator)__position._M_current);
  }
LAB_00146806:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar2;
}

Assistant:

bool LogManager::RemoveSink(const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);

    auto itSink = std::find_if(sinks.begin(), sinks.end(), [&name](const LogSinkInstance::Ref &other)->bool {
        return (other->GetName() == name);
    });

    if (itSink == sinks.end()) {
        return false;
    }
    sinks.erase(itSink);
    return true;
}